

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckDeprecated(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  uint code;
  bool bVar2;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    code = 0;
    bVar2 = true;
    if (node != (Node *)0x0) {
      pDVar1 = node->tag;
      if (pDVar1 != (Dict *)0x0) {
        bVar2 = pDVar1->id != TidyTag_APPLET;
        code = 0x2f5;
        if (bVar2) {
          code = 0;
        }
        if (bVar2 && pDVar1 != (Dict *)0x0) {
          bVar2 = pDVar1->id != TidyTag_BASEFONT;
          code = 0;
          if (!bVar2) {
            code = 0x2f6;
          }
          if (bVar2 && pDVar1 != (Dict *)0x0) {
            bVar2 = pDVar1->id != TidyTag_CENTER;
            code = 0x2f7;
            if (bVar2) {
              code = 0;
            }
            if (bVar2 && pDVar1 != (Dict *)0x0) {
              bVar2 = pDVar1->id != TidyTag_DIR;
              code = 0;
              if (!bVar2) {
                code = 0x2f8;
              }
              if (bVar2 && pDVar1 != (Dict *)0x0) {
                bVar2 = pDVar1->id != TidyTag_FONT;
                code = 0x2f9;
                if (bVar2) {
                  code = 0;
                }
                if (bVar2 && pDVar1 != (Dict *)0x0) {
                  bVar2 = pDVar1->id != TidyTag_ISINDEX;
                  code = 0;
                  if (!bVar2) {
                    code = 0x2fa;
                  }
                  if (bVar2 && pDVar1 != (Dict *)0x0) {
                    bVar2 = pDVar1->id != TidyTag_MENU;
                    code = 0x2fb;
                    if (bVar2) {
                      code = 0;
                    }
                    if (bVar2 && pDVar1 != (Dict *)0x0) {
                      bVar2 = pDVar1->id != TidyTag_S;
                      code = 0;
                      if (!bVar2) {
                        code = 0x2fc;
                      }
                      if (bVar2 && pDVar1 != (Dict *)0x0) {
                        bVar2 = pDVar1->id != TidyTag_STRIKE;
                        code = 0x2fd;
                        if (bVar2) {
                          code = 0;
                        }
                        if (bVar2 && pDVar1 != (Dict *)0x0) {
                          bVar2 = pDVar1->id != TidyTag_U;
                          code = 0x2fe;
                          if (bVar2) {
                            code = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (!bVar2) {
      prvTidyReport(doc,(Node *)0x0,node,code);
      return;
    }
  }
  return;
}

Assistant:

static void CheckDeprecated( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsAPPLET(node) )
            msgcode = REPLACE_DEPRECATED_HTML_APPLET;
        else if ( nodeIsBASEFONT(node) )
            msgcode = REPLACE_DEPRECATED_HTML_BASEFONT;
        else if ( nodeIsCENTER(node) )
            msgcode = REPLACE_DEPRECATED_HTML_CENTER;
        else if ( nodeIsDIR(node) )
            msgcode = REPLACE_DEPRECATED_HTML_DIR;
        else if ( nodeIsFONT(node) )
            msgcode = REPLACE_DEPRECATED_HTML_FONT;
        else if ( nodeIsISINDEX(node) )
            msgcode = REPLACE_DEPRECATED_HTML_ISINDEX;
        else if ( nodeIsMENU(node) )
            msgcode = REPLACE_DEPRECATED_HTML_MENU;
        else if ( nodeIsS(node) )
            msgcode = REPLACE_DEPRECATED_HTML_S;
        else if ( nodeIsSTRIKE(node) )
            msgcode = REPLACE_DEPRECATED_HTML_STRIKE;
        else if ( nodeIsU(node) )
            msgcode = REPLACE_DEPRECATED_HTML_U;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}